

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void new_localvar(LexState *ls,TString *name,int n)

{
  undefined2 uVar1;
  int iVar2;
  int iVar3;
  FuncState *fs;
  FuncState *pFVar4;
  Proto *pPVar5;
  global_State *g;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  LocVar *pLVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  fs = ls->fs;
  if ((int)((uint)fs->nactvar + n) < 200) {
    pFVar4 = ls->fs;
    pPVar5 = pFVar4->f;
    iVar2 = pPVar5->sizelocvars;
    if (iVar2 <= pFVar4->nlocvars) {
      pLVar8 = (LocVar *)
               luaM_growaux_(ls->L,pPVar5->locvars,&pPVar5->sizelocvars,0x10,0x7fff,
                             "too many local variables");
      pPVar5->locvars = pLVar8;
    }
    auVar7 = _DAT_001145e0;
    auVar6 = _DAT_001145d0;
    iVar3 = pPVar5->sizelocvars;
    if (iVar2 < iVar3) {
      lVar9 = (long)iVar3 - (long)iVar2;
      lVar10 = lVar9 + -1;
      auVar12._8_4_ = (int)lVar10;
      auVar12._0_8_ = lVar10;
      auVar12._12_4_ = (int)((ulong)lVar10 >> 0x20);
      pLVar8 = pPVar5->locvars + (long)iVar2 + 1;
      uVar11 = 0;
      auVar12 = auVar12 ^ _DAT_001145e0;
      do {
        auVar13._8_4_ = (int)uVar11;
        auVar13._0_8_ = uVar11;
        auVar13._12_4_ = (int)(uVar11 >> 0x20);
        auVar13 = (auVar13 | auVar6) ^ auVar7;
        if ((bool)(~(auVar13._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar13._0_4_ ||
                    auVar12._4_4_ < auVar13._4_4_) & 1)) {
          pLVar8[-1].varname = (TString *)0x0;
        }
        if ((auVar13._12_4_ != auVar12._12_4_ || auVar13._8_4_ <= auVar12._8_4_) &&
            auVar13._12_4_ <= auVar12._12_4_) {
          pLVar8->varname = (TString *)0x0;
        }
        uVar11 = uVar11 + 2;
        pLVar8 = pLVar8 + 2;
      } while ((lVar9 + 1U & 0xfffffffffffffffe) != uVar11);
    }
    pPVar5->locvars[pFVar4->nlocvars].varname = name;
    if ((((name->tsv).marked & 3) != 0) && ((pPVar5->marked & 4) != 0)) {
      g = ls->L->l_G;
      if (g->gcstate == '\x01') {
        reallymarkobject(g,(GCObject *)name);
      }
      else {
        pPVar5->marked = g->currentwhite & 3 | pPVar5->marked & 0xf8;
      }
    }
    uVar1 = pFVar4->nlocvars;
    pFVar4->nlocvars = uVar1 + 1;
    fs->actvar[(long)n + (ulong)fs->nactvar] = uVar1;
    return;
  }
  errorlimit(fs,200,"local variables");
}

Assistant:

static void new_localvar(LexState*ls,TString*name,int n){
FuncState*fs=ls->fs;
luaY_checklimit(fs,fs->nactvar+n+1,200,"local variables");
fs->actvar[fs->nactvar+n]=cast(unsigned short,registerlocalvar(ls,name));
}